

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRStore.cpp
# Opt level: O1

void __thiscall hdc::IRStore::IRStore(IRStore *this,IRValue *dst,IRValue *src,IRValue *offset)

{
  (this->super_IRInstruction).super_IR._vptr_IR = (_func_int **)&PTR_accept_001984d0;
  this->dst = dst;
  this->src = src;
  this->offset = offset;
  IRValue::makeUsedBy(dst,(IR *)this);
  IRValue::makeUsedBy(src,(IR *)this);
  IRValue::setCreatedBy(offset,(IR *)this);
  return;
}

Assistant:

IRStore::IRStore(IRValue *dst, IRValue *src, IRValue* offset) {
    this->dst = dst;
    this->src = src;
    this->offset = offset;

    dst->makeUsedBy(this);
    src->makeUsedBy(this);
    offset->setCreatedBy(this);
}